

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n_left_move<Header*,long_long>
               (Header *first,longlong n,Header *d_first)

{
  __index_type _Var1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  Header *pHVar5;
  Header *pHVar6;
  Header *pHVar7;
  long in_FS_OFFSET;
  Destructor local_58;
  anon_class_8_1_a78179b7_conflict local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pHVar7 = d_first + n;
  pHVar6 = first;
  pHVar5 = pHVar7;
  if (first < pHVar7) {
    pHVar6 = pHVar7;
    pHVar5 = first;
  }
  local_58.end = d_first;
  if (pHVar5 != d_first) {
    do {
      *(__index_type *)
       ((long)&(d_first->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18) = 0xff;
      _Var1 = *(__index_type *)
               ((long)&(first->name).data.
                       super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18);
      *(__index_type *)
       ((long)&(d_first->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18) = _Var1;
      local_40.__lhs = (_Move_ctor_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)d_first;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&&>
        ::_S_vtable._M_arr[(long)(char)_Var1 + 1]._M_data)
                (&local_40,(variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)first);
      pDVar2 = (first->value).d.d;
      (first->value).d.d = (Data *)0x0;
      (d_first->value).d.d = pDVar2;
      pcVar3 = (first->value).d.ptr;
      (first->value).d.ptr = (char *)0x0;
      (d_first->value).d.ptr = pcVar3;
      qVar4 = (first->value).d.size;
      (first->value).d.size = 0;
      (d_first->value).d.size = qVar4;
      d_first = d_first + 1;
      first = first + 1;
    } while (d_first != pHVar5);
  }
  local_58.iter = &local_58.intermediate;
  local_58.intermediate = d_first;
  if (d_first != pHVar7) {
    do {
      local_40.__lhs = (_Move_ctor_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)d_first;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
        ::_S_vtable._M_arr
        [(long)(char)*(__index_type *)
                      ((long)&(first->name).data.
                              super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> +
                      0x18) + 1]._M_data)
                ((anon_class_8_1_8991fb9c *)&local_40,
                 (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)first);
      pDVar2 = (d_first->value).d.d;
      (d_first->value).d.d = (first->value).d.d;
      (first->value).d.d = pDVar2;
      pcVar3 = (d_first->value).d.ptr;
      (d_first->value).d.ptr = (first->value).d.ptr;
      (first->value).d.ptr = pcVar3;
      qVar4 = (d_first->value).d.size;
      (d_first->value).d.size = (first->value).d.size;
      (first->value).d.size = qVar4;
      d_first = d_first + 1;
      first = first + 1;
    } while (d_first != pHVar7);
  }
  local_58.iter = &local_58.end;
  if (first != pHVar6) {
    q_relocate_overlap_n_left_move<Header*,long_long>();
  }
  q_relocate_overlap_n_left_move<Header_*,_long_long>::Destructor::~Destructor(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}